

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O3

void avlUpdateNode(NodeAVL **tree,NodeAVL *nd,double key)

{
  NodeAVL *pNVar1;
  NodeAVL *pNVar2;
  NodeAVL *pNVar3;
  
  pNVar2 = nd->parent;
  pNVar3 = nd;
  while (pNVar1 = pNVar2, pNVar1 != (NodeAVL *)0x0) {
    pNVar1->tmp = pNVar3;
    pNVar3 = pNVar1;
    pNVar2 = pNVar1->parent;
  }
  pNVar3 = avlRemove0(pNVar3,0);
  *tree = pNVar3;
  nd->key = key;
  nd->parent = (NodeAVL *)0x0;
  nd->tmp = (NodeAVL *)0x0;
  nd->left = (NodeAVL *)0x0;
  nd->right = (NodeAVL *)0x0;
  nd->height = 1;
  pNVar3 = avlInsert0(*tree,nd);
  *tree = pNVar3;
  return;
}

Assistant:

void avlUpdateNode( NodeAVL **tree, NodeAVL* nd, const double key ){
    #ifdef DEBUG_AVL
      printf( "avlUpdateNode id=%d\n", nd->id );
    #endif
    *tree = avlRemove0( avlGoUp( nd ), 0 );
    nd->key = key;
    clearTreeMatters( nd );
    *tree = avlInsert0( *tree, nd );
}